

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_add_asn1(CBB *cbb,CBB *out_contents,CBS_ASN1_TAG tag)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  CBS_ASN1_TAG tag_number;
  uint8_t tag_bits;
  CBS_ASN1_TAG tag_local;
  CBB *out_contents_local;
  CBB *cbb_local;
  
  iVar2 = CBB_flush(cbb);
  if (iVar2 == 0) {
    cbb_local._4_4_ = 0;
  }
  else {
    bVar1 = (byte)(tag >> 0x18) & 0xe0;
    uVar3 = tag & 0x1fffffff;
    if (uVar3 < 0x1f) {
      iVar2 = CBB_add_u8(cbb,bVar1 | (byte)uVar3);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      iVar2 = CBB_add_u8(cbb,bVar1 | 0x1f);
      if ((iVar2 == 0) || (iVar2 = add_base128_integer(cbb,(ulong)uVar3), iVar2 == 0)) {
        return 0;
      }
    }
    cbb_local._4_4_ = cbb_add_child(cbb,out_contents,'\x01',1);
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_add_asn1(CBB *cbb, CBB *out_contents, CBS_ASN1_TAG tag) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  // Split the tag into leading bits and tag number.
  uint8_t tag_bits = (tag >> CBS_ASN1_TAG_SHIFT) & 0xe0;
  CBS_ASN1_TAG tag_number = tag & CBS_ASN1_TAG_NUMBER_MASK;
  if (tag_number >= 0x1f) {
    // Set all the bits in the tag number to signal high tag number form.
    if (!CBB_add_u8(cbb, tag_bits | 0x1f) ||
        !add_base128_integer(cbb, tag_number)) {
      return 0;
    }
  } else if (!CBB_add_u8(cbb, tag_bits | tag_number)) {
    return 0;
  }

  // Reserve one byte of length prefix. |CBB_flush| will finish it later.
  return cbb_add_child(cbb, out_contents, /*len_len=*/1, /*is_asn1=*/1);
}